

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_loop::run_impl(statement_loop *this)

{
  bool bVar1;
  element_type *peVar2;
  long in_RDI;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  iterator __end2;
  iterator __begin2;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range2;
  scope_guard scope;
  _Self *in_stack_fffffffffffffed8;
  process_context *in_stack_fffffffffffffee0;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_48;
  long local_28;
  
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5d37c5);
  peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x5d37d1);
  if ((peVar2->break_block & 1U) != 0) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5d37e8);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x5d37f4);
    peVar2->break_block = false;
  }
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5d3809);
  peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x5d3815);
  if ((peVar2->continue_block & 1U) != 0) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5d382c);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x5d3838);
    peVar2->continue_block = false;
  }
  scope_guard::scope_guard
            ((scope_guard *)in_stack_fffffffffffffee0,(context_t *)in_stack_fffffffffffffed8);
  do {
    process_context::poll_event(in_stack_fffffffffffffee0);
    local_28 = in_RDI + 0x20;
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffed8);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffed8);
    while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8),
          bVar1) {
      std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
      operator*(&local_48);
      statement_base::run((statement_base *)in_stack_fffffffffffffee0);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5d3b78);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5d3b84);
      if ((peVar2->return_fcall & 1U) != 0) {
LAB_005d3c56:
        scope_guard::~scope_guard((scope_guard *)0x5d3c63);
        return;
      }
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5d3ba8);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5d3bb4);
      if ((peVar2->break_block & 1U) != 0) {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5d3bcb);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5d3bd7);
        peVar2->break_block = false;
        goto LAB_005d3c56;
      }
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5d3bf6);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5d3c02);
      if ((peVar2->continue_block & 1U) != 0) {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5d3c19);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5d3c25);
        peVar2->continue_block = false;
        break;
      }
      std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
      operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                  *)in_stack_fffffffffffffee0);
    }
    scope_guard::clear((scope_guard *)0x5d3c4f);
  } while( true );
}

Assistant:

void statement_loop::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		while (true) {
			current_process->poll_event();
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}